

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  ItemVector *pIVar7;
  ostream *poVar8;
  pointer __lhs;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string out;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  allocator<char> local_269;
  string *local_268;
  string *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar7 = cmComputeLinkInformation::GetItems(cli);
  local_268 = stdLibString;
  local_260 = __return_storage_ptr__;
  std::__cxx11::string::string(local_1f8,(string *)&cli->Config);
  __lhs = (pIVar7->
          super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar7->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  do {
    psVar3 = local_260;
    if (__lhs == pIVar1) {
      if (local_268->_M_string_length != 0) {
        poVar8 = std::operator<<(&local_1a8,(string *)local_268);
        std::operator<<(poVar8," ");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string(local_1f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      return psVar3;
    }
    if (bVar4) {
LAB_002b99cd:
      bVar4 = false;
    }
    else {
      if (__lhs->Target != (cmGeneratorTarget *)0x0) {
        TVar6 = cmGeneratorTarget::GetType(__lhs->Target);
        if (TVar6 == STATIC_LIBRARY) {
          pcVar2 = __lhs->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                     (allocator<char> *)&local_238);
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_258);
          if (bVar4) {
            std::__cxx11::string::~string((string *)&local_258);
          }
          else {
            pcVar2 = __lhs->Target;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,"CUDA_SEPARABLE_COMPILATION",&local_269);
            bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_258);
            if (bVar4) goto LAB_002b9947;
          }
        }
        goto LAB_002b99cd;
      }
LAB_002b9947:
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      if (__lhs->IsPath == true) {
        bVar4 = cmHasLiteralSuffix<std::__cxx11::string,3ul>(&__lhs->Value,(char (*) [3])0x469dfc);
        if (!bVar4) {
          bVar4 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(&__lhs->Value,(char (*) [5])".lib");
          if (!bVar4) goto LAB_002b9a44;
        }
        (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_238,this,__lhs);
        cmLinkLineComputer::ConvertToOutputFormat
                  (&local_218,&this->super_cmLinkLineComputer,&local_238);
        std::__cxx11::string::append((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
LAB_002b9a44:
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_1d8,&local_258);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar8 = std::operator<<(&local_1a8,(string *)&local_258);
          std::operator<<(poVar8," ");
        }
        bVar4 = false;
      }
      else {
        bVar5 = std::operator==(&__lhs->Value,"-framework");
        bVar4 = true;
        if (!bVar5) {
          bVar4 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(&__lhs->Value,(char (*) [2])0x45816a)
          ;
          if (bVar4) {
            bVar4 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                              (&__lhs->Value,(char (*) [3])0x463c81);
            if (!bVar4) {
              bVar4 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(&__lhs->Value,(char (*) [3])"-L")
              ;
              if (!bVar4) {
                bVar4 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                                  (&__lhs->Value,(char (*) [10])"--library");
                if (!bVar4) goto LAB_002b9a44;
              }
            }
          }
          std::__cxx11::string::append((string *)&local_258);
          goto LAB_002b9a44;
        }
      }
      std::__cxx11::string::~string((string *)&local_258);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = true;
      if (item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
            item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
          skip = false;
        }
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}